

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray.c
# Opt level: O0

uint32_t PackedArray_computeBitsPerItem(uint32_t *in,uint32_t count)

{
  int iVar1;
  uint32_t local_28;
  uint32_t local_24;
  uint local_1c;
  uint32_t bitsPerItem;
  uint32_t in_max;
  uint32_t i;
  uint32_t count_local;
  uint32_t *in_local;
  
  local_1c = 0;
  for (bitsPerItem = 0; bitsPerItem < count; bitsPerItem = bitsPerItem + 1) {
    if (local_1c < in[bitsPerItem]) {
      local_24 = in[bitsPerItem];
    }
    else {
      local_24 = local_1c;
    }
    local_1c = local_24;
  }
  iVar1 = __PackedArray_highestBitSet(local_1c);
  local_28 = iVar1 + 1;
  if (local_28 == 0) {
    local_28 = 1;
  }
  return local_28;
}

Assistant:

uint32_t PackedArray_computeBitsPerItem(const uint32_t* in, uint32_t count)
{
  uint32_t i, in_max, bitsPerItem;

  in_max = 0;
  for (i = 0; i < count; ++i)
    in_max = in[i] > in_max ? in[i] : in_max;

  bitsPerItem = __PackedArray_highestBitSet(in_max) + 1;
  return bitsPerItem == 0 ? 1 : bitsPerItem;
}